

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O1

bool __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::GetNextJointPolicyAndValueSpecific
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,
          shared_ptr<JointPolicyDiscretePure> *jpol,double *value)

{
  int *piVar1;
  element_type *peVar2;
  char cVar3;
  JointPolicyDiscretePure *__tmp;
  ostream *poVar4;
  bool bVar5;
  double dVar6;
  shared_ptr<PartialJPDPValuePair> jppv;
  undefined1 local_78 [16];
  long *local_68;
  shared_count local_60;
  element_type *local_58;
  shared_count sStack_50;
  element_type *local_48;
  shared_count asStack_40 [2];
  
  if (this->_m_solved == false) {
    (**(code **)(*(long *)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                           super_BGIP_IncrementalSolverInterface + 0x20))(this);
  }
  else {
    ReSolve(this);
  }
  cVar3 = BGIPSolution::IsEmptyJPPV();
  if (cVar3 == '\0') {
    BGIPSolution::GetNextSolutionJPPV();
    local_58 = (element_type *)local_68[2];
    sStack_50.pi_ = (sp_counted_base *)local_68[3];
    if (local_68[3] != 0) {
      LOCK();
      piVar1 = (int *)(local_68[3] + 8);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    if (sStack_50.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (sStack_50.pi_)->use_count_ = (sStack_50.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_78 = ZEXT816(0) << 0x20;
    local_48 = jpol->px;
    asStack_40[0].pi_ = (jpol->pn).pi_;
    jpol->px = local_58;
    (jpol->pn).pi_ = sStack_50.pi_;
    boost::detail::shared_count::~shared_count(asStack_40);
    peVar2 = jpol->px;
    boost::detail::shared_count::~shared_count((shared_count *)(local_78 + 8));
    boost::detail::shared_count::~shared_count(&sStack_50);
    bVar5 = peVar2 != (element_type *)0x0;
    if (bVar5) {
      dVar6 = (double)(**(code **)(*local_68 + 0x18))();
      *value = dVar6;
      BGIPSolution::PopNextSolutionJPPV();
    }
  }
  else {
    cVar3 = BGIPSolution::IsEmptyPJPDP();
    if (cVar3 != '\0') {
      local_48 = jpol->px;
      asStack_40[0].pi_ = (jpol->pn).pi_;
      bVar5 = false;
      jpol->px = (element_type *)0x0;
      (jpol->pn).pi_ = (sp_counted_base *)0x0;
      boost::detail::shared_count::~shared_count(asStack_40);
      *value = 0.0;
      goto LAB_0011f844;
    }
    BGIPSolution::GetNextSolutionPJPDP();
    (**(code **)(*local_68 + 0x10))(&local_58);
    if (sStack_50.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (sStack_50.pi_)->use_count_ = (sStack_50.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_78 = ZEXT816(0) << 0x20;
    local_48 = jpol->px;
    asStack_40[0].pi_ = (jpol->pn).pi_;
    jpol->px = local_58;
    (jpol->pn).pi_ = sStack_50.pi_;
    boost::detail::shared_count::~shared_count(asStack_40);
    peVar2 = jpol->px;
    boost::detail::shared_count::~shared_count((shared_count *)(local_78 + 8));
    boost::detail::shared_count::~shared_count(&sStack_50);
    bVar5 = peVar2 != (element_type *)0x0;
    if (bVar5) {
      dVar6 = (double)(**(code **)(*local_68 + 0x18))();
      *value = dVar6;
      BGIPSolution::PopNextSolutionPJPDP();
    }
  }
  boost::detail::shared_count::~shared_count(&local_60);
LAB_0011f844:
  if (-1 < this->_m_verbosity) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BGIP_SolverBranchAndBound found jpol ",0x25);
    std::ostream::_M_insert<void_const*>(&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," value ",7);
    poVar4 = std::ostream::_M_insert<double>(*value);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," and ",5);
    BGIPSolution::GetNrFoundSolutions();
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," solutions left",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  this->_m_nrSolutionsComputed = this->_m_nrSolutionsComputed + 1;
  return bVar5;
}

Assistant:

bool GetNextJointPolicyAndValueSpecific(boost::shared_ptr<JointPolicyDiscretePure> &jpol, double &value)
    {
        // If we never solved this BG, do that now
        if(!_m_solved)
            Solve();
        // even if we have more solutions stored in the solution queue, we
        // don't know whether they are optimal, so we need to resolve to
        // make sure
        else
            ReSolve();

        bool foundSolution=false;

        // this requires some magic to make sure we return from
        // the correct pool, which depends on the JP type
        if(!this->IsEmptyJPPV())
        {                
            const boost::shared_ptr<JPPVValuePair> jppv=
                this->GetNextSolutionJPPV();
            //if((jpol=boost::dynamic_pointer_cast<JP>(jppv->GetJPPV())))
            if((jpol=boost::static_pointer_cast<JointPolicyDiscretePure>(jppv->GetJPPV())))
            {
                foundSolution=true;
                value=jppv->GetValue();
                this->PopNextSolutionJPPV();
            }
        }
        else if(!this->IsEmptyPJPDP())
        {
            boost::shared_ptr<PartialJPDPValuePair> jppv=
                this->GetNextSolutionPJPDP();
            //if((jpol=boost::dynamic_pointer_cast<JP>(jppv->GetJPol())))
            if((jpol=boost::static_pointer_cast<JointPolicyDiscretePure>(jppv->GetJPol())))
            {
                foundSolution=true;
                value=jppv->GetValue();
                this->PopNextSolutionPJPDP();
            }
        }
        else
        {
            jpol.reset();
            value=0;
        }
        if(_m_verbosity>=0)
            std::cout << "BGIP_SolverBranchAndBound found jpol "
                      << jpol << " value " << value << " and " 
                      << this->GetNrFoundSolutions()
                      << " solutions left" 
                      << std::endl;
        _m_nrSolutionsComputed++;

        return(foundSolution);
    }